

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_hw.c
# Opt level: O2

uint32_t crc32c_hw(void *input,int len,uint32_t crc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *buf;
  void *pvVar4;
  
  uVar1 = ~crc;
  for (pvVar4 = input; (uVar3 = (ulong)uVar1, 0 < len && (((ulong)pvVar4 & 7) != 0));
      pvVar4 = (void *)((long)pvVar4 + 1)) {
    uVar1 = crc32(uVar1,*input);
    len = len - 1;
    input = (void *)((long)input + 1);
  }
  for (; 7 < (uint)len; len = len - 8) {
    uVar3 = crc32(uVar3 & 0xffffffff,*input);
    input = (void *)((long)input + 8);
  }
  for (; 3 < (uint)len; len = len - 4) {
    uVar1 = crc32((int)uVar3,*input);
    uVar3 = (ulong)uVar1;
    input = (void *)((long)input + 4);
  }
  for (; 1 < (uint)len; len = len - 2) {
    uVar1 = crc32((int)uVar3,*input);
    uVar3 = (ulong)uVar1;
    input = (void *)((long)input + 2);
  }
  for (uVar1 = 0; len != uVar1; uVar1 = uVar1 + 1) {
    uVar2 = crc32((uint)uVar3,*input);
    uVar3 = (ulong)uVar2;
    input = (void *)((long)input + 1);
  }
  return ~(uint)uVar3;
}

Assistant:

uint32_t crc32c_hw(const void *input, int len, uint32_t crc)
{
    const char* buf = (const char*)input;

    // XOR the initial CRC with INT_MAX
    crc ^= 0xFFFFFFFF;

    // Align the input to the word boundary
    for (; (len > 0) && ((size_t)buf & ALIGN_MASK); len--, buf++) {
        crc = _mm_crc32_u8(crc, *buf);
    }

    // Blast off the CRC32 calculation
#ifdef __x86_64__
    CALC_CRC(_mm_crc32_u64, crc, uint64_t, buf, len);
#endif
    CALC_CRC(_mm_crc32_u32, crc, uint32_t, buf, len);
    CALC_CRC(_mm_crc32_u16, crc, uint16_t, buf, len);
    CALC_CRC(_mm_crc32_u8, crc, uint8_t, buf, len);

    // Post-process the crc
    return (crc ^ 0xFFFFFFFF);
}